

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_async_from_sync_iterator_finalizer(JSRuntime *rt,JSValue val)

{
  int *piVar1;
  int iVar2;
  JSValue JVar3;
  JSValue *pJVar4;
  
  if (((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x30)) {
    pJVar4 = *(JSValue **)((long)val.u.ptr + 0x30);
  }
  else {
    pJVar4 = (JSValue *)0x0;
  }
  if (pJVar4 != (JSValue *)0x0) {
    JVar3 = *pJVar4;
    if ((0xfffffff4 < (uint)pJVar4->tag) &&
       (iVar2 = *(pJVar4->u).ptr, *(int *)(pJVar4->u).ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(rt,JVar3);
    }
    piVar1 = (int *)pJVar4[1].u.ptr;
    JVar3 = pJVar4[1];
    if ((0xfffffff4 < (uint)pJVar4[1].tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(rt,JVar3);
    }
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar4);
    return;
  }
  return;
}

Assistant:

static void js_async_from_sync_iterator_finalizer(JSRuntime *rt, JSValue val)
{
    JSAsyncFromSyncIteratorData *s =
        JS_GetOpaque(val, JS_CLASS_ASYNC_FROM_SYNC_ITERATOR);
    if (s) {
        JS_FreeValueRT(rt, s->sync_iter);
        JS_FreeValueRT(rt, s->next_method);
        js_free_rt(rt, s);
    }
}